

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::type_t>::
holder<std::function<cs_impl::any()>const&,std::type_index_const&,std::shared_ptr<cs::name_space>&>
          (holder<cs::type_t> *this,function<cs_impl::any_()> *args,type_index *args_1,
          shared_ptr<cs::name_space> *args_2)

{
  type_index *in_RDX;
  shared_ptr<cs::name_space> *in_RDI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__x;
  function<cs_impl::any_()> *in_stack_ffffffffffffff90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff98;
  type_index in_stack_ffffffffffffffa0;
  
  baseHolder::baseHolder((baseHolder *)in_RDI);
  (in_RDI->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__holder_003df940;
  __x = &(in_RDI->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  std::function<cs_impl::any_()>::function
            (in_stack_ffffffffffffff90,(function<cs_impl::any_()> *)__x);
  cs::type_id::type_id((type_id *)&stack0xffffffffffffffa0,in_RDX,0);
  std::shared_ptr<cs::name_space>::shared_ptr
            (in_RDI,(shared_ptr<cs::name_space> *)&stack0xffffffffffffff90);
  cs::type_t::type_t((type_t *)in_stack_ffffffffffffffa0._M_target,
                     (function<cs_impl::any_()> *)in_stack_ffffffffffffff98._M_pi,
                     (type_id *)in_stack_ffffffffffffff90,(namespace_t *)__x);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x239c09);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x239c13);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}